

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servak.cpp
# Opt level: O1

string_view mime_type(string_view path)

{
  bool bVar1;
  size_type pos;
  char *pcVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  string_view sVar12;
  string_view lhs;
  string_view lhs_00;
  string_view lhs_01;
  string_view lhs_02;
  string_view lhs_03;
  string_view lhs_04;
  string_view lhs_05;
  string_view lhs_06;
  string_view lhs_07;
  string_view lhs_08;
  string_view lhs_09;
  string_view lhs_10;
  string_view lhs_11;
  string_view lhs_12;
  string_view lhs_13;
  string_view rhs;
  string_view rhs_00;
  string_view rhs_01;
  string_view rhs_02;
  string_view rhs_03;
  string_view rhs_04;
  string_view rhs_05;
  string_view rhs_06;
  string_view rhs_07;
  string_view rhs_08;
  string_view rhs_09;
  string_view rhs_10;
  string_view rhs_11;
  string_view rhs_12;
  string_view rhs_13;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  bVar11.len_ = 1;
  bVar11.ptr_ = ".";
  pos = boost::basic_string_view<char,_std::char_traits<char>_>::rfind
                  (&local_30,bVar11,0xffffffffffffffff);
  if (pos == 0xffffffffffffffff) {
    pcVar2 = (char *)0x0;
    bVar11 = (basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0xffffffffffffffff);
  }
  else {
    bVar11 = boost::basic_string_view<char,_std::char_traits<char>_>::substr
                       (&local_30,pos,0xffffffffffffffff);
    pcVar2 = bVar11.ptr_;
  }
  sVar9 = bVar11.len_;
  if (sVar9 == 3) {
    lVar3 = 0;
    pcVar8 = "application/javascript";
    sVar10 = 0x16;
    do {
      if (lVar3 == 3) goto LAB_0010cac8;
      cVar6 = pcVar2[lVar3];
      cVar5 = ".js"[lVar3];
      lVar3 = lVar3 + 1;
    } while (cVar6 == cVar5);
    lVar4 = 0;
    do {
      cVar7 = cVar6 + ' ';
      if (0x19 < (int)cVar6 - 0x41U) {
        cVar7 = cVar6;
      }
      cVar6 = cVar5 + ' ';
      if (0x19 < (int)cVar5 - 0x41U) {
        cVar6 = cVar5;
      }
      if (cVar7 != cVar6) goto LAB_0010c98c;
      cVar6 = pcVar2[lVar3 + lVar4];
      cVar5 = ".js"[lVar3 + lVar4];
      lVar4 = lVar4 + 1;
    } while (4 - lVar3 != lVar4);
  }
  else if (sVar9 == 5) {
    lVar3 = 0;
    pcVar8 = "text/html";
    sVar10 = 9;
    do {
      if (lVar3 == 5) goto LAB_0010cac8;
      cVar6 = pcVar2[lVar3];
      cVar5 = "index.html"[lVar3 + 5];
      lVar3 = lVar3 + 1;
    } while (cVar6 == cVar5);
    lVar4 = 0;
    do {
      cVar7 = cVar6 + ' ';
      if (0x19 < (int)cVar6 - 0x41U) {
        cVar7 = cVar6;
      }
      cVar6 = cVar5 + ' ';
      if (0x19 < (int)cVar5 - 0x41U) {
        cVar6 = cVar5;
      }
      if (cVar7 != cVar6) goto LAB_0010c98c;
      cVar6 = pcVar2[lVar3 + lVar4];
      cVar5 = "index.html"[lVar3 + lVar4 + 5];
      lVar4 = lVar4 + 1;
    } while (6 - lVar3 != lVar4);
  }
  else if (sVar9 == 4) {
    lVar3 = 0;
    pcVar8 = "text/html";
    sVar10 = 9;
    do {
      if (lVar3 == 4) goto LAB_0010cac8;
      cVar6 = pcVar2[lVar3];
      cVar5 = ".htm"[lVar3];
      lVar3 = lVar3 + 1;
    } while (cVar6 == cVar5);
    lVar4 = 0;
    do {
      cVar7 = cVar6 + ' ';
      if (0x19 < (int)cVar6 - 0x41U) {
        cVar7 = cVar6;
      }
      cVar6 = cVar5 + ' ';
      if (0x19 < (int)cVar5 - 0x41U) {
        cVar6 = cVar5;
      }
      if (cVar7 != cVar6) {
        lVar3 = 0;
        pcVar8 = "text/html";
        sVar10 = 9;
        goto LAB_0010c720;
      }
      cVar6 = pcVar2[lVar3 + lVar4];
      cVar5 = ".htm"[lVar3 + lVar4];
      lVar4 = lVar4 + 1;
    } while (5 - lVar3 != lVar4);
  }
  else {
LAB_0010c98c:
    lhs.len_ = sVar9;
    lhs.ptr_ = pcVar2;
    rhs.len_ = 5;
    rhs.ptr_ = ".json";
    bVar1 = boost::beast::iequals(lhs,rhs);
    if (bVar1) {
      sVar10 = 0x10;
      pcVar8 = "application/json";
    }
    else {
      lhs_00.len_ = sVar9;
      lhs_00.ptr_ = pcVar2;
      rhs_00.len_ = 4;
      rhs_00.ptr_ = ".xml";
      bVar1 = boost::beast::iequals(lhs_00,rhs_00);
      if (bVar1) {
        sVar10 = 0xf;
        pcVar8 = "application/xml";
      }
      else {
        lhs_01.len_ = sVar9;
        lhs_01.ptr_ = pcVar2;
        rhs_01.len_ = 4;
        rhs_01.ptr_ = ".swf";
        bVar1 = boost::beast::iequals(lhs_01,rhs_01);
        if (bVar1) {
          sVar10 = 0x1d;
          pcVar8 = "application/x-shockwave-flash";
        }
        else {
          lhs_02.len_ = sVar9;
          lhs_02.ptr_ = pcVar2;
          rhs_02.len_ = 4;
          rhs_02.ptr_ = ".flv";
          bVar1 = boost::beast::iequals(lhs_02,rhs_02);
          if (bVar1) {
            sVar10 = 0xb;
            pcVar8 = "video/x-flv";
          }
          else {
            lhs_03.len_ = sVar9;
            lhs_03.ptr_ = pcVar2;
            rhs_03.len_ = 4;
            rhs_03.ptr_ = ".png";
            bVar1 = boost::beast::iequals(lhs_03,rhs_03);
            if (bVar1) {
              pcVar8 = "image/png";
            }
            else {
              lhs_04.len_ = sVar9;
              lhs_04.ptr_ = pcVar2;
              rhs_04.len_ = 4;
              rhs_04.ptr_ = ".jpe";
              bVar1 = boost::beast::iequals(lhs_04,rhs_04);
              sVar10 = 10;
              pcVar8 = "image/jpeg";
              if (((bVar1) ||
                  (lhs_05.len_ = sVar9, lhs_05.ptr_ = pcVar2, rhs_05.len_ = 5, rhs_05.ptr_ = ".jpeg"
                  , bVar1 = boost::beast::iequals(lhs_05,rhs_05), bVar1)) ||
                 (lhs_06.len_ = sVar9, lhs_06.ptr_ = pcVar2, rhs_06.len_ = 4, rhs_06.ptr_ = ".jpg",
                 bVar1 = boost::beast::iequals(lhs_06,rhs_06), bVar1)) goto LAB_0010cac8;
              lhs_07.len_ = sVar9;
              lhs_07.ptr_ = pcVar2;
              rhs_07.len_ = 4;
              rhs_07.ptr_ = ".gif";
              bVar1 = boost::beast::iequals(lhs_07,rhs_07);
              if (bVar1) {
                pcVar8 = "image/gif";
              }
              else {
                lhs_08.len_ = sVar9;
                lhs_08.ptr_ = pcVar2;
                rhs_08.len_ = 4;
                rhs_08.ptr_ = ".bmp";
                bVar1 = boost::beast::iequals(lhs_08,rhs_08);
                if (!bVar1) {
                  lhs_09.len_ = sVar9;
                  lhs_09.ptr_ = pcVar2;
                  rhs_09.len_ = 4;
                  rhs_09.ptr_ = ".ico";
                  bVar1 = boost::beast::iequals(lhs_09,rhs_09);
                  if (bVar1) {
                    sVar10 = 0x18;
                    pcVar8 = "image/vnd.microsoft.icon";
                  }
                  else {
                    lhs_10.len_ = sVar9;
                    lhs_10.ptr_ = pcVar2;
                    rhs_10.len_ = 5;
                    rhs_10.ptr_ = ".tiff";
                    bVar1 = boost::beast::iequals(lhs_10,rhs_10);
                    pcVar8 = "image/tiff";
                    if ((!bVar1) &&
                       (lhs_11.len_ = sVar9, lhs_11.ptr_ = pcVar2, rhs_11.len_ = 4,
                       rhs_11.ptr_ = ".tif", bVar1 = boost::beast::iequals(lhs_11,rhs_11), !bVar1))
                    {
                      lhs_12.len_ = sVar9;
                      lhs_12.ptr_ = pcVar2;
                      rhs_12.len_ = 4;
                      rhs_12.ptr_ = ".svg";
                      bVar1 = boost::beast::iequals(lhs_12,rhs_12);
                      if (bVar1) {
                        sVar10 = 0xd;
                        pcVar8 = "image/svg+xml";
                      }
                      else {
                        lhs_13.len_ = sVar9;
                        lhs_13.ptr_ = pcVar2;
                        rhs_13.len_ = 5;
                        rhs_13.ptr_ = ".svgz";
                        bVar1 = boost::beast::iequals(lhs_13,rhs_13);
                        pcVar8 = "application/text";
                        if (bVar1) {
                          pcVar8 = "image/svg+xml";
                        }
                        sVar10 = (ulong)!bVar1 * 3 + 0xd;
                      }
                    }
                  }
                  goto LAB_0010cac8;
                }
                pcVar8 = "image/bmp";
              }
            }
            sVar10 = 9;
          }
        }
      }
    }
  }
  goto LAB_0010cac8;
  while( true ) {
    cVar6 = pcVar2[lVar3];
    cVar5 = ".php"[lVar3];
    lVar3 = lVar3 + 1;
    if (cVar6 != cVar5) break;
LAB_0010c720:
    if (lVar3 == 4) goto LAB_0010cac8;
  }
  lVar4 = 0;
  do {
    cVar7 = cVar6 + ' ';
    if (0x19 < (int)cVar6 - 0x41U) {
      cVar7 = cVar6;
    }
    cVar6 = cVar5 + ' ';
    if (0x19 < (int)cVar5 - 0x41U) {
      cVar6 = cVar5;
    }
    if (cVar7 != cVar6) {
      lVar3 = 0;
      pcVar8 = "text/css";
      sVar10 = 8;
      goto LAB_0010c7c8;
    }
    cVar6 = pcVar2[lVar3 + lVar4];
    cVar5 = ".php"[lVar3 + lVar4];
    lVar4 = lVar4 + 1;
  } while (5 - lVar3 != lVar4);
  goto LAB_0010cac8;
  while( true ) {
    cVar6 = pcVar2[lVar3];
    cVar5 = ".css"[lVar3];
    lVar3 = lVar3 + 1;
    if (cVar6 != cVar5) break;
LAB_0010c7c8:
    if (lVar3 == 4) goto LAB_0010cac8;
  }
  lVar4 = 0;
  do {
    cVar7 = cVar6 + ' ';
    if (0x19 < (int)cVar6 - 0x41U) {
      cVar7 = cVar6;
    }
    cVar6 = cVar5 + ' ';
    if (0x19 < (int)cVar5 - 0x41U) {
      cVar6 = cVar5;
    }
    if (cVar7 != cVar6) {
      lVar3 = 0;
      pcVar8 = "text/plain";
      sVar10 = 10;
      goto LAB_0010c870;
    }
    cVar6 = pcVar2[lVar3 + lVar4];
    cVar5 = ".css"[lVar3 + lVar4];
    lVar4 = lVar4 + 1;
  } while (5 - lVar3 != lVar4);
  goto LAB_0010cac8;
  while( true ) {
    cVar6 = pcVar2[lVar3];
    cVar5 = ".txt"[lVar3];
    lVar3 = lVar3 + 1;
    if (cVar6 != cVar5) break;
LAB_0010c870:
    if (lVar3 == 4) goto LAB_0010cac8;
  }
  lVar4 = 0;
  do {
    cVar7 = cVar6 + ' ';
    if (0x19 < (int)cVar6 - 0x41U) {
      cVar7 = cVar6;
    }
    cVar6 = cVar5 + ' ';
    if (0x19 < (int)cVar5 - 0x41U) {
      cVar6 = cVar5;
    }
    if (cVar7 != cVar6) goto LAB_0010c98c;
    cVar6 = pcVar2[lVar3 + lVar4];
    cVar5 = ".txt"[lVar3 + lVar4];
    lVar4 = lVar4 + 1;
  } while (5 - lVar3 != lVar4);
LAB_0010cac8:
  sVar12.len_ = sVar10;
  sVar12.ptr_ = pcVar8;
  return sVar12;
}

Assistant:

beast::string_view
mime_type(beast::string_view path)
{
    using beast::iequals;
    auto const ext = [&path]
    {
        auto const pos = path.rfind(".");
        if(pos == beast::string_view::npos)
            return beast::string_view{};
        return path.substr(pos);
    }();
    if(iequals(ext, ".htm"))  return "text/html";
    if(iequals(ext, ".html")) return "text/html";
    if(iequals(ext, ".php"))  return "text/html";
    if(iequals(ext, ".css"))  return "text/css";
    if(iequals(ext, ".txt"))  return "text/plain";
    if(iequals(ext, ".js"))   return "application/javascript";
    if(iequals(ext, ".json")) return "application/json";
    if(iequals(ext, ".xml"))  return "application/xml";
    if(iequals(ext, ".swf"))  return "application/x-shockwave-flash";
    if(iequals(ext, ".flv"))  return "video/x-flv";
    if(iequals(ext, ".png"))  return "image/png";
    if(iequals(ext, ".jpe"))  return "image/jpeg";
    if(iequals(ext, ".jpeg")) return "image/jpeg";
    if(iequals(ext, ".jpg"))  return "image/jpeg";
    if(iequals(ext, ".gif"))  return "image/gif";
    if(iequals(ext, ".bmp"))  return "image/bmp";
    if(iequals(ext, ".ico"))  return "image/vnd.microsoft.icon";
    if(iequals(ext, ".tiff")) return "image/tiff";
    if(iequals(ext, ".tif"))  return "image/tiff";
    if(iequals(ext, ".svg"))  return "image/svg+xml";
    if(iequals(ext, ".svgz")) return "image/svg+xml";
    return "application/text";
}